

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DPIImportSyntax::getChild(DPIImportSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff58;
  TokenOrSyntax *in_stack_ffffffffffffff60;
  nullptr_t in_stack_ffffffffffffff68;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffff58);
    break;
  case 1:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token);
    break;
  case 2:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_00);
    break;
  case 3:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_01);
    break;
  case 4:
    token_02.info = in_RDI;
    token_02._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_02);
    break;
  case 5:
    token_03.info = in_RDI;
    token_03._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_03);
    break;
  case 6:
    not_null<slang::syntax::FunctionPrototypeSyntax_*>::get
              ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)(in_RSI + 0xa0));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case 7:
    token_04.info = in_RDI;
    token_04._0_8_ = in_stack_ffffffffffffff68;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff60,token_04);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffff68);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax DPIImportSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return specString;
        case 3: return property;
        case 4: return c_identifier;
        case 5: return equals;
        case 6: return method.get();
        case 7: return semi;
        default: return nullptr;
    }
}